

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackIFWRepository.cxx
# Opt level: O3

void __thiscall
cmCPackeIFWUpdatesPatcher::CharacterDataHandler
          (cmCPackeIFWUpdatesPatcher *this,char *data,int length)

{
  int iVar1;
  string content;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,data,data + length);
  iVar1 = std::__cxx11::string::compare((char *)&local_38);
  if (iVar1 != 0) {
    iVar1 = std::__cxx11::string::compare((char *)&local_38);
    if (iVar1 != 0) {
      iVar1 = std::__cxx11::string::compare((char *)&local_38);
      if (iVar1 != 0) {
        iVar1 = std::__cxx11::string::compare((char *)&local_38);
        if (iVar1 != 0) {
          cmXMLWriter::Content<std::__cxx11::string>(this->xout,&local_38);
        }
      }
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void CharacterDataHandler(const char* data, int length) CM_OVERRIDE
  {
    std::string content(data, data + length);
    if (content == "" || content == " " || content == "  " ||
        content == "\n") {
      return;
    }
    this->xout.Content(content);
  }